

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_extensions.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_0::ValidateClspvReflectionInstruction
          (ValidationState_t *_,Instruction *inst,uint32_t version)

{
  pointer psVar1;
  pointer psVar2;
  pointer pEVar3;
  uint32_t info_index;
  bool bVar4;
  __type _Var5;
  NonSemanticClspvReflectionInstructions NVar6;
  uint uVar7;
  spv_result_t sVar8;
  Op OVar9;
  uint uVar10;
  Instruction *pIVar11;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *psVar12;
  _Base_ptr p_Var13;
  vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
  *pvVar14;
  uint *puVar15;
  spv_result_t sVar16;
  char *pcVar17;
  EntryPointDescription *desc;
  pointer __rhs;
  long lVar18;
  ulong uVar19;
  size_t sStack_250;
  string inst_name;
  DiagnosticStream local_228;
  string name_str;
  
  bVar4 = ValidationState_t::IsVoidType(_,(inst->inst_).type_id);
  if (!bVar4) {
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Return Type must be OpTypeVoid";
    goto LAB_00550907;
  }
  NVar6 = Instruction::GetOperandAs<NonSemanticClspvReflectionInstructions>(inst,3);
  uVar7 = NVar6 - NonSemanticClspvReflectionKernel;
  if (0x27 < uVar7) {
    return SPV_SUCCESS;
  }
  if (version < *(uint *)(&DAT_007d122c + (ulong)uVar7 * 4)) {
    pIVar11 = inst;
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
              (&inst_name,(_anonymous_namespace_ *)_,(ValidationState_t *)inst,pIVar11);
    std::operator<<((ostream *)&local_228,(string *)&inst_name);
    std::operator<<((ostream *)&local_228," requires version ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
    std::operator<<((ostream *)&local_228,", but parsed version is ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
    std::__cxx11::string::_M_dispose();
    goto LAB_00550919;
  }
  switch(uVar7) {
  case 0:
    (anonymous_namespace)::ReflectionInstructionName_abi_cxx11_
              (&inst_name,(_anonymous_namespace_ *)_,(ValidationState_t *)inst,
               (Instruction *)&switchD_00550941::switchdataD_007d117c);
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    pIVar11 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar11->inst_).opcode == 0x36) {
      puVar15 = (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      do {
        if (puVar15 ==
            (_->entry_points_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_005512eb;
        uVar10 = *puVar15;
        puVar15 = puVar15 + 1;
      } while (uVar10 != uVar7);
      psVar12 = ValidationState_t::GetExecutionModels(_,uVar7);
      if ((psVar12 ==
           (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
            *)0x0) || ((psVar12->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)) {
LAB_005512eb:
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        std::operator<<((ostream *)&local_228,(string *)&inst_name);
        pcVar17 = " does not reference an entry-point";
      }
      else {
        for (p_Var13 = (psVar12->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var13 != &(psVar12->_M_t)._M_impl.super__Rb_tree_header;
            p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
          if (p_Var13[1]._M_color != 5) {
            ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_228,(string *)&inst_name);
            pcVar17 = " must refer only to GLCompute entry-points";
            goto LAB_00551313;
          }
        }
        uVar10 = Instruction::GetOperandAs<unsigned_int>(inst,5);
        pIVar11 = ValidationState_t::FindDef(_,uVar10);
        if ((pIVar11 != (Instruction *)0x0) && ((pIVar11->inst_).opcode == 7)) {
          Instruction::GetOperandAs<std::__cxx11::string>(&name_str,pIVar11,1);
          pvVar14 = ValidationState_t::entry_point_descriptions(_,uVar7);
          __rhs = (pvVar14->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_start;
          pEVar3 = (pvVar14->
                   super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          do {
            if (__rhs == pEVar3) {
              ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
              pcVar17 = "Name must match an entry-point for Kernel";
              goto LAB_00551606;
            }
            _Var5 = std::operator==(&name_str,&__rhs->name);
            __rhs = __rhs + 1;
          } while (!_Var5);
          lVar18 = (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(inst->operands_).
                         super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar19 = lVar18 >> 4;
          if ((version < 5) && (6 < uVar19)) {
            ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
            std::operator<<((ostream *)&local_228,"Version ");
            std::ostream::_M_insert<unsigned_long>((ulong)&local_228);
            std::operator<<((ostream *)&local_228," of the ");
            std::operator<<((ostream *)&local_228,(string *)&inst_name);
            std::operator<<((ostream *)&local_228," instruction can only have 2 additional operands"
                           );
            sVar8 = local_228.error_;
LAB_00551618:
            DiagnosticStream::~DiagnosticStream(&local_228);
          }
          else {
            sVar16 = SPV_SUCCESS;
            sVar8 = SPV_SUCCESS;
            if (6 < uVar19) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
              bVar4 = IsUint32Constant(_,uVar7);
              if (!bVar4) {
                ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
                pcVar17 = "NumArguments must be a 32-bit unsigned integer OpConstant";
LAB_00551606:
                std::operator<<((ostream *)&local_228,pcVar17);
                sVar8 = local_228.error_;
                goto LAB_00551618;
              }
              sVar8 = sVar16;
              if (lVar18 != 0x70) {
                uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
                bVar4 = IsUint32Constant(_,uVar7);
                if (!bVar4) {
                  ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
                  pcVar17 = "Flags must be a 32-bit unsigned integer OpConstant";
                  goto LAB_00551606;
                }
                if (8 < uVar19) {
                  uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,8);
                  OVar9 = ValidationState_t::GetIdOpcode(_,uVar7);
                  if (OVar9 != OpString) {
                    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
                    pcVar17 = "Attributes must be an OpString";
                    goto LAB_00551606;
                  }
                }
              }
            }
          }
          std::__cxx11::string::_M_dispose();
          goto LAB_0055132a;
        }
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "Name must be an OpString";
      }
    }
    else {
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      std::operator<<((ostream *)&local_228,(string *)&inst_name);
      pcVar17 = " does not reference a function";
    }
LAB_00551313:
    std::operator<<((ostream *)&local_228,pcVar17);
    DiagnosticStream::~DiagnosticStream(&local_228);
    sVar8 = local_228.error_;
LAB_0055132a:
    std::__cxx11::string::_M_dispose();
    return sVar8;
  case 1:
    lVar18 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar7);
    if (OVar9 == OpString) {
      if ((ulong)(lVar18 >> 4) < 6) {
        return SPV_SUCCESS;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar7);
      if (OVar9 == OpString) {
        if (lVar18 == 0x60) {
          return SPV_SUCCESS;
        }
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
        bVar4 = IsUint32Constant(_,uVar7);
        if (bVar4) {
          if ((ulong)(lVar18 >> 4) < 8) {
            return SPV_SUCCESS;
          }
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
          bVar4 = IsUint32Constant(_,uVar7);
          if (bVar4) {
            if (lVar18 == 0x80) {
              return SPV_SUCCESS;
            }
            uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,8);
            bVar4 = IsUint32Constant(_,uVar7);
            if (bVar4) {
              return SPV_SUCCESS;
            }
            ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar17 = "TypeQualifier must be a 32-bit unsigned integer OpConstant";
          }
          else {
            ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
            pcVar17 = "AccessQualifier must be a 32-bit unsigned integer OpConstant";
          }
        }
        else {
          ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
          pcVar17 = "AddressQualifier must be a 32-bit unsigned integer OpConstant";
        }
      }
      else {
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "TypeName must be an OpString";
      }
    }
    else {
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "Name must be an OpString";
    }
    break;
  default:
    lVar18 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
      bVar4 = IsUint32Constant(_,uVar7);
      if (!bVar4) goto LAB_00551185;
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) {
LAB_00550fa0:
        if (lVar18 != 0x90) {
          return SPV_SUCCESS;
        }
        info_index = 8;
LAB_00550faf:
        sVar8 = ValidateArgInfo(_,inst,info_index);
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
        return SPV_SUCCESS;
      }
LAB_005511a7:
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "Binding must be a 32-bit unsigned integer OpConstant";
    }
    else {
LAB_00550fc4:
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "Ordinal must be a 32-bit unsigned integer OpConstant";
    }
    break;
  case 4:
  case 5:
  case 0x1a:
    psVar1 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_finish;
    psVar2 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00550fc4;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
      bVar4 = IsUint32Constant(_,uVar7);
      if (!bVar4) goto LAB_005511a7;
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,8);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,9);
        bVar4 = IsUint32Constant(_,uVar7);
        if (bVar4) {
          if ((long)psVar1 - (long)psVar2 != 0xb0) {
            return SPV_SUCCESS;
          }
          info_index = 10;
          goto LAB_00550faf;
        }
        goto LAB_0055101e;
      }
      goto LAB_005510b1;
    }
LAB_00551185:
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "DescriptorSet must be a 32-bit unsigned integer OpConstant";
    break;
  case 6:
  case 0x19:
    lVar18 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00550fc4;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) goto LAB_00550fa0;
      goto LAB_0055101e;
    }
LAB_005510b1:
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Offset must be a 32-bit unsigned integer OpConstant";
    break;
  case 10:
    lVar18 = (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->operands_).
                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00550fc4;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) goto LAB_00550fa0;
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "ElemSize must be a 32-bit unsigned integer OpConstant";
    }
    else {
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "SpecId must be a 32-bit unsigned integer OpConstant";
    }
    break;
  case 0xb:
  case 0xc:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) {
        sStack_250 = 6;
        goto LAB_00550b19;
      }
LAB_00551392:
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "Y must be a 32-bit unsigned integer OpConstant";
    }
    else {
LAB_00551370:
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "X must be a 32-bit unsigned integer OpConstant";
    }
    break;
  case 0xd:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Dim must be a 32-bit unsigned integer OpConstant";
    break;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005510b1;
    sStack_250 = 5;
    goto LAB_00551003;
  case 0x14:
  case 0x15:
  case 0x1b:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551185;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005511a7;
LAB_00550be4:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    OVar9 = ValidationState_t::GetIdOpcode(_,uVar7);
    if (OVar9 == OpString) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Data must be an OpString";
    break;
  case 0x16:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551185;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005511a7;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Mask must be a 32-bit unsigned integer OpConstant";
    break;
  case 0x17:
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551370;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551392;
    sStack_250 = 7;
LAB_00550b19:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sStack_250);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Z must be a 32-bit unsigned integer OpConstant";
    break;
  case 0x18:
    sStack_250 = 4;
    goto LAB_00551003;
  case 0x1c:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      bVar4 = IsUint32Constant(_,uVar7);
      if (bVar4) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
        bVar4 = IsUint32Constant(_,uVar7);
        if (bVar4) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "PointerSize must be a 32-bit unsigned integer OpConstant";
      }
      else {
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "PointerOffset must be a 32-bit unsigned integer OpConstant";
      }
    }
    else {
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "ObjectOffset must be a 32-bit unsigned integer OpConstant";
    }
    break;
  case 0x1d:
  case 0x1e:
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00550fc4;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005510b1;
    sStack_250 = 7;
    goto LAB_00551003;
  case 0x1f:
  case 0x20:
    sVar8 = ValidateKernelDecl(_,inst);
    if (sVar8 != SPV_SUCCESS) {
      return sVar8;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00550fc4;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551185;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,7);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005511a7;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,8);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005510b1;
    sStack_250 = 9;
    goto LAB_00551003;
  case 0x23:
  case 0x24:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005510b1;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) goto LAB_00550be4;
    goto LAB_0055101e;
  case 0x25:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      OVar9 = ValidationState_t::GetIdOpcode(_,uVar7);
      if (OVar9 == OpString) {
        uVar19 = 6;
        do {
          if ((ulong)((long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar19) {
            return SPV_SUCCESS;
          }
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,uVar19);
          bVar4 = IsUint32Constant(_,uVar7);
          uVar19 = uVar19 + 1;
        } while (bVar4);
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "ArgumentSizes must be a 32-bit unsigned integer OpConstant";
      }
      else {
        ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
        pcVar17 = "FormatString must be an OpString";
      }
    }
    else {
      ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
      pcVar17 = "PrintfID must be a 32-bit unsigned integer OpConstant";
    }
    break;
  case 0x26:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_00551185;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005511a7;
    sStack_250 = 6;
LAB_00551003:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sStack_250);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      return SPV_SUCCESS;
    }
LAB_0055101e:
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "Size must be a 32-bit unsigned integer OpConstant";
    break;
  case 0x27:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,4);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_005510b1;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,5);
    bVar4 = IsUint32Constant(_,uVar7);
    if (!bVar4) goto LAB_0055101e;
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,6);
    bVar4 = IsUint32Constant(_,uVar7);
    if (bVar4) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_228,_,SPV_ERROR_INVALID_ID,inst);
    pcVar17 = "BufferSize must be a 32-bit unsigned integer OpConstant";
  }
LAB_00550907:
  std::operator<<((ostream *)&local_228,pcVar17);
LAB_00550919:
  DiagnosticStream::~DiagnosticStream(&local_228);
  return local_228.error_;
}

Assistant:

spv_result_t ValidateClspvReflectionInstruction(ValidationState_t& _,
                                                const Instruction* inst,
                                                uint32_t version) {
  if (!_.IsVoidType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Return Type must be OpTypeVoid";
  }

  uint32_t required_version = 0;
  const auto ext_inst =
      inst->GetOperandAs<NonSemanticClspvReflectionInstructions>(3);
  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
    case NonSemanticClspvReflectionArgumentInfo:
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentWorkgroup:
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
    case NonSemanticClspvReflectionSpecConstantWorkDim:
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionLiteralSampler:
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      required_version = 1;
      break;
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      required_version = 2;
      break;
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
    case NonSemanticClspvReflectionArgumentPointerUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      required_version = 3;
      break;
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      required_version = 4;
      break;
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
    case NonSemanticClspvReflectionPrintfInfo:
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      required_version = 5;
      break;
    default:
      break;
  }
  if (version < required_version) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << ReflectionInstructionName(_, inst) << " requires version "
           << required_version << ", but parsed version is " << version;
  }

  switch (ext_inst) {
    case NonSemanticClspvReflectionKernel:
      return ValidateClspvReflectionKernel(_, inst, version);
    case NonSemanticClspvReflectionArgumentInfo:
      return ValidateClspvReflectionArgumentInfo(_, inst);
    case NonSemanticClspvReflectionArgumentStorageBuffer:
    case NonSemanticClspvReflectionArgumentUniform:
    case NonSemanticClspvReflectionArgumentSampledImage:
    case NonSemanticClspvReflectionArgumentStorageImage:
    case NonSemanticClspvReflectionArgumentSampler:
    case NonSemanticClspvReflectionArgumentStorageTexelBuffer:
    case NonSemanticClspvReflectionArgumentUniformTexelBuffer:
      return ValidateClspvReflectionArgumentBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodStorageBuffer:
    case NonSemanticClspvReflectionArgumentPodUniform:
    case NonSemanticClspvReflectionArgumentPointerUniform:
      return ValidateClspvReflectionArgumentOffsetBuffer(_, inst);
    case NonSemanticClspvReflectionArgumentPodPushConstant:
    case NonSemanticClspvReflectionArgumentPointerPushConstant:
      return ValidateClspvReflectionArgumentPushConstant(_, inst);
    case NonSemanticClspvReflectionArgumentWorkgroup:
      return ValidateClspvReflectionArgumentWorkgroup(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkgroupSize:
    case NonSemanticClspvReflectionSpecConstantGlobalOffset:
      return ValidateClspvReflectionSpecConstantTriple(_, inst);
    case NonSemanticClspvReflectionSpecConstantWorkDim:
      return ValidateClspvReflectionSpecConstantWorkDim(_, inst);
    case NonSemanticClspvReflectionPushConstantGlobalOffset:
    case NonSemanticClspvReflectionPushConstantEnqueuedLocalSize:
    case NonSemanticClspvReflectionPushConstantGlobalSize:
    case NonSemanticClspvReflectionPushConstantRegionOffset:
    case NonSemanticClspvReflectionPushConstantNumWorkgroups:
    case NonSemanticClspvReflectionPushConstantRegionGroupOffset:
      return ValidateClspvReflectionPushConstant(_, inst);
    case NonSemanticClspvReflectionConstantDataStorageBuffer:
    case NonSemanticClspvReflectionConstantDataUniform:
    case NonSemanticClspvReflectionProgramScopeVariablesStorageBuffer:
      return ValidateClspvReflectionInitializedData(_, inst);
    case NonSemanticClspvReflectionLiteralSampler:
      return ValidateClspvReflectionSampler(_, inst);
    case NonSemanticClspvReflectionPropertyRequiredWorkgroupSize:
      return ValidateClspvReflectionPropertyRequiredWorkgroupSize(_, inst);
    case NonSemanticClspvReflectionSpecConstantSubgroupMaxSize:
      return ValidateClspvReflectionSubgroupMaxSize(_, inst);
    case NonSemanticClspvReflectionProgramScopeVariablePointerRelocation:
      return ValidateClspvReflectionPointerRelocation(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderPushConstant:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypePushConstant:
      return ValidateClspvReflectionImageMetadataPushConstant(_, inst);
    case NonSemanticClspvReflectionImageArgumentInfoChannelOrderUniform:
    case NonSemanticClspvReflectionImageArgumentInfoChannelDataTypeUniform:
      return ValidateClspvReflectionImageMetadataUniform(_, inst);
    case NonSemanticClspvReflectionConstantDataPointerPushConstant:
    case NonSemanticClspvReflectionProgramScopeVariablePointerPushConstant:
      return ValidateClspvReflectionPushConstantData(_, inst);
    case NonSemanticClspvReflectionPrintfInfo:
      return ValidateClspvReflectionPrintfInfo(_, inst);
    case NonSemanticClspvReflectionPrintfBufferStorageBuffer:
      return ValidateClspvReflectionPrintfStorageBuffer(_, inst);
    case NonSemanticClspvReflectionPrintfBufferPointerPushConstant:
      return ValidateClspvReflectionPrintfPushConstant(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}